

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_dwp.c
# Opt level: O0

err_t beltDWPUnwrap(void *dest,void *src1,size_t count1,void *src2,size_t count2,octet *mac,
                   octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  octet *mac_00;
  octet *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  octet *in_R9;
  void *state;
  void *in_stack_ffffffffffffffb8;
  
  if ((((((mac != &DAT_00000010) && (mac != (octet *)0x18)) && (mac != (octet *)0x20)) ||
       ((bVar1 = memIsValid(in_RSI,(size_t)in_RDX), bVar1 == 0 ||
        (bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 == 0)))) ||
      ((bVar1 = memIsValid(in_R9,8), bVar1 == 0 ||
       ((bVar1 = memIsValid(state,(size_t)mac), bVar1 == 0 ||
        (bVar1 = memIsValid((void *)count2,0x10), bVar1 == 0)))))) ||
     (bVar1 = memIsValid(in_RDI,(size_t)in_RDX), bVar1 == 0)) {
    return 0x6d;
  }
  beltDWP_keep();
  mac_00 = (octet *)blobCreate((size_t)in_stack_ffffffffffffffb8);
  if (mac_00 == (octet *)0x0) {
    return 0x6e;
  }
  beltDWPStart(in_RDX,in_RCX,(size_t)in_R8,in_R9);
  beltDWPStepI(in_R8,(size_t)in_R9,mac_00);
  beltDWPStepA(in_R8,(size_t)in_R9,mac_00);
  bVar1 = beltDWPStepV(mac_00,in_stack_ffffffffffffffb8);
  if (bVar1 == 0) {
    blobClose((blob_t)0x173534);
    return 0x1ff;
  }
  memMove(mac_00,in_stack_ffffffffffffffb8,0x173552);
  beltDWPStepD(mac_00,(size_t)in_stack_ffffffffffffffb8,(void *)0x173566);
  blobClose((blob_t)0x173570);
  return 0;
}

Assistant:

err_t beltDWPUnwrap(void* dest, const void* src1, size_t count1,
	const void* src2, size_t count2, const octet mac[8], const octet key[],
	size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (len != 16 && len != 24 && len != 32 ||
		!memIsValid(src1, count1) ||
		!memIsValid(src2, count2) ||
		!memIsValid(mac, 8) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count1))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltDWP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// снять защиту
	beltDWPStart(state, key, len, iv);
	beltDWPStepI(src2, count2, state);
	beltDWPStepA(src1, count1, state);
	if (!beltDWPStepV(mac, state))
	{
		blobClose(state);
		return ERR_BAD_MAC;
	}
	memMove(dest, src1, count1);
	beltDWPStepD(dest, count1, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}